

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_Accessors_Test::TestBody
          (GeneratedMessageReflectionTest_Accessors_Test *this)

{
  Descriptor *base_descriptor;
  undefined1 local_3d0 [8];
  ReflectionTester reflection_tester;
  TestAllTypes message;
  GeneratedMessageReflectionTest_Accessors_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&reflection_tester.import_baz_);
  base_descriptor = proto2_unittest::TestAllTypes::descriptor();
  TestUtil::ReflectionTester::ReflectionTester((ReflectionTester *)local_3d0,base_descriptor);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&reflection_tester.import_baz_);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection
            ((ReflectionTester *)local_3d0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ExpectRepeatedFieldsModified<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)&reflection_tester.import_baz_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&reflection_tester.import_baz_);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, Accessors) {
  // Set every field to a unique value then go back and check all those
  // values.
  unittest::TestAllTypes message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  reflection_tester.SetAllFieldsViaReflection(&message);
  TestUtil::ExpectAllFieldsSet(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(message);

  reflection_tester.ModifyRepeatedFieldsViaReflection(&message);
  TestUtil::ExpectRepeatedFieldsModified(message);
}